

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  byte *pbVar1;
  ZSTD_format_e format;
  U64 UVar2;
  byte bVar3;
  ZSTD_ErrorCode ZVar4;
  size_t sVar5;
  ulong uVar6;
  XXH64_hash_t XVar7;
  byte *src_00;
  uint *src_01;
  byte *pbVar8;
  byte *dst_00;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  ulong uStackY_a0;
  byte *local_90;
  blockProperties_t local_4c;
  size_t local_40;
  void *local_38;
  
  if (ddict != (ZSTD_DDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("dict==NULL || ddict==NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                  ,0x428,
                  "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                 );
  }
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ZSTD_DDict_dictContent(ddict);
    dictSize = ZSTD_DDict_dictSize(ddict);
  }
  bVar3 = 0;
  local_90 = (byte *)dst;
  do {
    while( true ) {
      sVar10 = 0xffffffffffffffb8;
      sVar5 = ZSTD_startingInputLength(dctx->format);
      if (srcSize < sVar5) {
        if (srcSize == 0) {
          sVar10 = (long)local_90 - (long)dst;
        }
        return sVar10;
      }
      if ((srcSize < 4) || ((*src & 0xfffffff0) != 0x184d2a50)) break;
      if (srcSize < 8) {
        return 0xffffffffffffffb8;
      }
      if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
        return 0xfffffffffffffff2;
      }
      uVar6 = (ulong)*(uint *)((long)src + 4) + 8;
      bVar11 = srcSize < uVar6;
      srcSize = srcSize - uVar6;
      if (bVar11) {
        return 0xffffffffffffffb8;
      }
      src = (void *)((long)src + uVar6);
    }
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar5 = ZSTD_decompressBegin_usingDict(dctx,dict,dictSize);
      if (0xffffffffffffff88 < sVar5) {
        return sVar5;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    local_38 = dict;
    ZSTD_checkContinuity(dctx,local_90,dstCapacity);
    format = dctx->format;
    uStackY_a0 = sVar10;
    if (((((ulong)(format == ZSTD_f_zstd1) * 4 + 5 <= srcSize) &&
         (sVar5 = ZSTD_frameHeaderSize_internal(src,(ulong)(format == ZSTD_f_zstd1) * 4 + 1,format),
         uStackY_a0 = sVar5, sVar5 < 0xffffffffffffff89)) &&
        (uStackY_a0 = sVar10, sVar5 + 3 <= srcSize)) &&
       (uStackY_a0 = ZSTD_decodeFrameHeader(dctx,src,sVar5), uStackY_a0 < 0xffffffffffffff89)) {
      pbVar1 = local_90 + dstCapacity;
      src_01 = (uint *)(sVar5 + (long)src);
      uVar6 = srcSize - sVar5;
      dst_00 = local_90;
      do {
        uStackY_a0 = ZSTD_getcBlockSize(src_01,uVar6,&local_4c);
        if (0xffffffffffffff88 < uStackY_a0) goto LAB_005f1631;
        uVar9 = uVar6 - 3;
        uVar6 = uVar9 - uStackY_a0;
        if (uVar9 < uStackY_a0) {
          uStackY_a0 = 0xffffffffffffffb8;
          goto LAB_005f1631;
        }
        src_00 = (byte *)((long)src_01 + 3);
        pbVar8 = pbVar1;
        if (src_00 < pbVar1) {
          pbVar8 = src_00;
        }
        if (src_00 < dst_00) {
          pbVar8 = pbVar1;
        }
        local_40 = uStackY_a0;
        if (local_4c.blockType == bt_compressed) {
          uStackY_a0 = ZSTD_decompressBlock_internal
                                 (dctx,dst_00,(long)pbVar8 - (long)dst_00,src_00,uStackY_a0,1,
                                  not_streaming);
          if (0xffffffffffffff88 < uStackY_a0) goto LAB_005f1631;
        }
        else if (local_4c.blockType == bt_rle) {
          uStackY_a0 = (ulong)local_4c.origSize;
          if ((ulong)((long)pbVar8 - (long)dst_00) < uStackY_a0) {
LAB_005f1600:
            uStackY_a0 = 0xffffffffffffffba;
            goto LAB_005f1631;
          }
          if (dst_00 == (byte *)0x0) {
joined_r0x005f158d:
            if (uStackY_a0 != 0) {
              uStackY_a0 = 0xffffffffffffffb6;
              goto LAB_005f1631;
            }
            uStackY_a0 = 0;
          }
          else {
            memset(dst_00,(uint)*src_00,uStackY_a0);
          }
        }
        else {
          if (local_4c.blockType != bt_raw) {
            uStackY_a0 = 0xffffffffffffffec;
            goto LAB_005f1631;
          }
          if ((ulong)((long)pbVar1 - (long)dst_00) < uStackY_a0) goto LAB_005f1600;
          if (dst_00 == (byte *)0x0) goto joined_r0x005f158d;
          memmove(dst_00,src_00,uStackY_a0);
        }
        if (dctx->validateChecksum != 0) {
          ZSTD_XXH64_update(&dctx->xxhState,dst_00,uStackY_a0);
        }
        dst_00 = dst_00 + uStackY_a0;
        src_01 = (uint *)(src_00 + local_40);
      } while (local_4c.lastBlock == 0);
      UVar2 = (dctx->fParams).frameContentSize;
      uStackY_a0 = (long)dst_00 - (long)local_90;
      if ((UVar2 == 0xffffffffffffffff) || (uStackY_a0 == UVar2)) {
        if ((dctx->fParams).checksumFlag != 0) {
          if ((uVar6 < 4) ||
             ((dctx->forceIgnoreChecksum == ZSTD_d_validateChecksum &&
              (XVar7 = ZSTD_XXH64_digest(&dctx->xxhState), *src_01 != (uint)XVar7)))) {
            uStackY_a0 = 0xffffffffffffffea;
            goto LAB_005f1631;
          }
          src_01 = src_01 + 1;
          uVar6 = uVar6 - 4;
        }
        srcSize = uVar6;
        ZSTD_DCtx_trace_end(dctx,uStackY_a0,(long)src_01 - (long)src,0);
        src = src_01;
      }
      else {
        uStackY_a0 = 0xffffffffffffffec;
      }
    }
LAB_005f1631:
    ZVar4 = ZSTD_getErrorCode(uStackY_a0);
    if ((bool)(bVar3 & ZVar4 == ZSTD_error_prefix_unknown)) {
      return 0xffffffffffffffb8;
    }
    if (0xffffffffffffff88 < uStackY_a0) {
      return uStackY_a0;
    }
    bVar11 = dstCapacity < uStackY_a0;
    dstCapacity = dstCapacity - uStackY_a0;
    if (bVar11) {
      __assert_fail("res <= dstCapacity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x46d,
                    "size_t ZSTD_decompressMultiFrame(ZSTD_DCtx *, void *, size_t, const void *, size_t, const void *, size_t, const ZSTD_DDict *)"
                   );
    }
    local_90 = local_90 + uStackY_a0;
    bVar3 = 1;
    dict = local_38;
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        if (srcSize >= 4) {
            U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(5, "reading magic number %08X", (unsigned)magicNumber);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                /* skippable frame detected : skip it */
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "invalid skippable frame");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue; /* check next frame */
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}